

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O0

OPJ_BOOL opj_tcd_t1_decode(opj_tcd_t *p_tcd)

{
  opj_tcd_tile_t *poVar1;
  OPJ_BOOL OVar2;
  opj_t1_t *p_t1;
  opj_tccp_t *local_40;
  opj_tccp_t *l_tccp;
  opj_tcd_tilecomp_t *l_tile_comp;
  opj_tcd_tile_t *l_tile;
  opj_t1_t *l_t1;
  OPJ_UINT32 compno;
  opj_tcd_t *p_tcd_local;
  
  poVar1 = p_tcd->tcd_image->tiles;
  l_tccp = (opj_tccp_t *)poVar1->comps;
  local_40 = p_tcd->tcp->tccps;
  p_t1 = opj_t1_create(0);
  if (p_t1 == (opj_t1_t *)0x0) {
    p_tcd_local._4_4_ = 0;
  }
  else {
    for (l_t1._4_4_ = 0; l_t1._4_4_ < poVar1->numcomps; l_t1._4_4_ = l_t1._4_4_ + 1) {
      OVar2 = opj_t1_decode_cblks(p_t1,(opj_tcd_tilecomp_t *)l_tccp,local_40);
      if (OVar2 == 0) {
        opj_t1_destroy(p_t1);
        return 0;
      }
      l_tccp = (opj_tccp_t *)&l_tccp->stepsizes[4].mant;
      local_40 = local_40 + 1;
    }
    opj_t1_destroy(p_t1);
    p_tcd_local._4_4_ = 1;
  }
  return p_tcd_local._4_4_;
}

Assistant:

static OPJ_BOOL opj_tcd_t1_decode ( opj_tcd_t *p_tcd )
{
        OPJ_UINT32 compno;
        opj_t1_t * l_t1;
        opj_tcd_tile_t * l_tile = p_tcd->tcd_image->tiles;
        opj_tcd_tilecomp_t* l_tile_comp = l_tile->comps;
        opj_tccp_t * l_tccp = p_tcd->tcp->tccps;


        l_t1 = opj_t1_create(OPJ_FALSE);
        if (l_t1 == 00) {
                return OPJ_FALSE;
        }

        for (compno = 0; compno < l_tile->numcomps; ++compno) {
                /* The +3 is headroom required by the vectorized DWT */
                if (OPJ_FALSE == opj_t1_decode_cblks(l_t1, l_tile_comp, l_tccp)) {
                        opj_t1_destroy(l_t1);
                        return OPJ_FALSE;
                }
                ++l_tile_comp;
                ++l_tccp;
        }

        opj_t1_destroy(l_t1);

        return OPJ_TRUE;
}